

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

int width_from_owner_or_zero_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    Am_Object::Am_Object(local_38,&Am_Scrolling_Group);
    bVar1 = Am_Object::Is_Instance_Of(&local_20,local_38);
    Am_Object::~Am_Object(local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_20,0x18e,0);
      self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
    }
    else {
      pAVar2 = Am_Object::Get(&local_20,0x66,0);
      self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
    }
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Object::~Am_Object(&local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, width_from_owner_or_zero)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid()) {
    if (owner.Is_Instance_Of(Am_Scrolling_Group))
      return owner.Get(Am_INNER_WIDTH);
    else
      return owner.Get(Am_WIDTH);
  } else
    return 0;
}